

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3DoOptimize(Fts3Table *p,int bReturnDone)

{
  byte bVar1;
  sqlite3_stmt *p_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iIndex;
  long in_FS_OFFSET;
  sqlite3_stmt *pAllLangid;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pAllLangid = (sqlite3_stmt *)0x0;
  uVar2 = sqlite3Fts3PendingTermsFlush(p);
  if (uVar2 == 0) {
    uVar4 = 0;
    uVar2 = fts3SqlStmt(p,0x1b,&pAllLangid,(sqlite3_value **)0x0);
    p_00 = pAllLangid;
    if (uVar2 == 0) {
      sqlite3_bind_int(pAllLangid,1,p->iPrevLangid);
      sqlite3_bind_int(p_00,2,p->nIndex);
      bVar1 = 0;
      while (iVar3 = sqlite3_step(p_00), iVar3 == 100) {
        iIndex = 0;
        iVar3 = sqlite3_column_int(p_00,0);
        while ((uVar4 == 0 && (iIndex < p->nIndex))) {
          uVar4 = fts3SegmentMerge(p,iVar3,iIndex,-2);
          iIndex = iIndex + 1;
          if (uVar4 == 0x65) {
            uVar4 = 0;
            bVar1 = 1;
          }
        }
      }
      uVar2 = sqlite3_reset(p_00);
      if (uVar4 != 0) {
        uVar2 = uVar4;
      }
      uVar4 = (uint)bVar1;
    }
  }
  else {
    uVar4 = 0;
  }
  sqlite3Fts3SegmentsClose(p);
  uVar5 = 0x65;
  if (uVar4 == 0) {
    uVar5 = uVar2;
  }
  if (uVar2 != 0) {
    uVar5 = uVar2;
  }
  if (bReturnDone == 0) {
    uVar5 = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar5;
}

Assistant:

static int fts3DoOptimize(Fts3Table *p, int bReturnDone){
  int bSeenDone = 0;
  int rc;
  sqlite3_stmt *pAllLangid = 0;

  rc = sqlite3Fts3PendingTermsFlush(p);
  if( rc==SQLITE_OK ){
    rc = fts3SqlStmt(p, SQL_SELECT_ALL_LANGID, &pAllLangid, 0);
  }
  if( rc==SQLITE_OK ){
    int rc2;
    sqlite3_bind_int(pAllLangid, 1, p->iPrevLangid);
    sqlite3_bind_int(pAllLangid, 2, p->nIndex);
    while( sqlite3_step(pAllLangid)==SQLITE_ROW ){
      int i;
      int iLangid = sqlite3_column_int(pAllLangid, 0);
      for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
        rc = fts3SegmentMerge(p, iLangid, i, FTS3_SEGCURSOR_ALL);
        if( rc==SQLITE_DONE ){
          bSeenDone = 1;
          rc = SQLITE_OK;
        }
      }
    }
    rc2 = sqlite3_reset(pAllLangid);
    if( rc==SQLITE_OK ) rc = rc2;
  }

  sqlite3Fts3SegmentsClose(p);

  return (rc==SQLITE_OK && bReturnDone && bSeenDone) ? SQLITE_DONE : rc;
}